

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O2

CURLcode imap_do(connectdata *conn,_Bool *done)

{
  void *pvVar1;
  undefined4 *puVar2;
  bool bVar3;
  imapstate iVar4;
  _Bool *p_Var5;
  _Bool _Var6;
  char cVar7;
  CURLcode CVar8;
  int iVar9;
  char *pcVar10;
  size_t sVar11;
  char *pcVar12;
  char *pcVar13;
  _Bool *p_Var14;
  Curl_easy *pCVar15;
  long lVar16;
  connectdata *pcVar17;
  char *pcVar18;
  char *value;
  connectdata *local_50;
  char *name;
  size_t local_40;
  _Bool *local_38;
  
  *done = false;
  pCVar15 = conn->data;
  pvVar1 = (pCVar15->req).protop;
  pcVar13 = (pCVar15->state).path;
  lVar16 = 1;
  pcVar18 = pcVar13 + -1;
  local_50 = conn;
  local_38 = done;
  do {
    pcVar12 = pcVar18;
    pcVar18 = pcVar12 + 1;
    _Var6 = imap_is_bchar(pcVar12[1]);
    lVar16 = lVar16 + -1;
  } while (_Var6);
  if (lVar16 == 0) {
    *(undefined8 *)((long)pvVar1 + 8) = 0;
  }
  else {
    pcVar10 = pcVar18;
    if ((pcVar13 < pcVar18) && (pcVar10 = pcVar12, *pcVar12 != '/')) {
      pcVar10 = pcVar18;
    }
    CVar8 = Curl_urldecode(pCVar15,pcVar13,(long)pcVar10 - (long)pcVar13,(char **)((long)pvVar1 + 8)
                           ,(size_t *)0x0,true);
    if (CVar8 != CURLE_OK) {
      return CVar8;
    }
  }
  while( true ) {
    cVar7 = *pcVar18;
    if (cVar7 != ';') break;
    pcVar13 = pcVar18 + 1;
    pcVar12 = pcVar18 + 2;
    sVar11 = 0;
    pcVar18 = pcVar13;
    while( true ) {
      if (pcVar12[-1] == '\0') {
        return CURLE_URL_MALFORMAT;
      }
      if (pcVar12[-1] == '=') break;
      pcVar12 = pcVar12 + 1;
      sVar11 = sVar11 + 1;
      pcVar18 = pcVar18 + 1;
    }
    CVar8 = Curl_urldecode(pCVar15,pcVar13,sVar11,&name,(size_t *)0x0,true);
    if (CVar8 != CURLE_OK) {
      return CVar8;
    }
    sVar11 = 0xffffffffffffffff;
    do {
      pcVar13 = pcVar18 + 1;
      pcVar18 = pcVar18 + 1;
      _Var6 = imap_is_bchar(*pcVar13);
      sVar11 = sVar11 + 1;
    } while (_Var6);
    CVar8 = Curl_urldecode(pCVar15,pcVar12,sVar11,&value,&local_40,true);
    if (CVar8 != CURLE_OK) {
      (*Curl_cfree)(name);
      return CVar8;
    }
    iVar9 = Curl_strcasecompare(name,"UIDVALIDITY");
    if ((iVar9 == 0) || (*(long *)((long)pvVar1 + 0x10) != 0)) {
      iVar9 = Curl_strcasecompare(name,"UID");
      if ((iVar9 == 0) || (*(long *)((long)pvVar1 + 0x18) != 0)) {
        iVar9 = Curl_strcasecompare(name,"SECTION");
        if ((iVar9 == 0) || (*(long *)((long)pvVar1 + 0x20) != 0)) {
          iVar9 = Curl_strcasecompare(name,"PARTIAL");
          if ((iVar9 == 0) || (*(long *)((long)pvVar1 + 0x28) != 0)) {
            (*Curl_cfree)(name);
            (*Curl_cfree)(value);
            return CURLE_URL_MALFORMAT;
          }
          if ((local_40 != 0) && (value[local_40 - 1] == '/')) {
            value[local_40 - 1] = '\0';
          }
          *(char **)((long)pvVar1 + 0x28) = value;
        }
        else {
          if ((local_40 != 0) && (value[local_40 - 1] == '/')) {
            value[local_40 - 1] = '\0';
          }
          *(char **)((long)pvVar1 + 0x20) = value;
        }
      }
      else {
        if ((local_40 != 0) && (value[local_40 - 1] == '/')) {
          value[local_40 - 1] = '\0';
        }
        *(char **)((long)pvVar1 + 0x18) = value;
      }
    }
    else {
      if ((local_40 != 0) && (value[local_40 - 1] == '/')) {
        value[local_40 - 1] = '\0';
      }
      *(char **)((long)pvVar1 + 0x10) = value;
    }
    value = (char *)0x0;
    (*Curl_cfree)(name);
    (*Curl_cfree)(value);
  }
  if (((*(long *)((long)pvVar1 + 8) != 0) && (cVar7 == '?')) &&
     (*(long *)((long)pvVar1 + 0x18) == 0)) {
    sVar11 = 0xffffffffffffffff;
    do {
      _Var6 = imap_is_bchar(pcVar18[sVar11 + 2]);
      sVar11 = sVar11 + 1;
    } while (_Var6);
    CVar8 = Curl_urldecode(pCVar15,pcVar18 + 1,sVar11,(char **)((long)pvVar1 + 0x30),(size_t *)0x0,
                           true);
    if (CVar8 != CURLE_OK) {
      return CVar8;
    }
    cVar7 = (pcVar18 + 1)[sVar11];
  }
  pcVar17 = local_50;
  if (cVar7 != '\0') {
    return CURLE_URL_MALFORMAT;
  }
  pCVar15 = local_50->data;
  pcVar13 = (pCVar15->set).str[6];
  if (pcVar13 != (char *)0x0) {
    pvVar1 = (pCVar15->req).protop;
    CVar8 = Curl_urldecode(pCVar15,pcVar13,0,(char **)((long)pvVar1 + 0x38),(size_t *)0x0,true);
    if (CVar8 != CURLE_OK) {
      return CVar8;
    }
    pcVar13 = *(char **)((long)pvVar1 + 0x38);
    for (pcVar18 = pcVar13; *pcVar18 != '\0'; pcVar18 = pcVar18 + 1) {
      if (*pcVar18 == ' ') {
        pcVar18 = (*Curl_cstrdup)(pcVar18);
        *(char **)((long)pvVar1 + 0x40) = pcVar18;
        *pcVar13 = '\0';
        if (*(long *)((long)pvVar1 + 0x40) == 0) {
          return CURLE_OUT_OF_MEMORY;
        }
        break;
      }
      pcVar13 = pcVar13 + 1;
    }
  }
  pCVar15 = pcVar17->data;
  (pCVar15->req).size = -1;
  Curl_pgrsSetUploadCounter(pCVar15,0);
  Curl_pgrsSetDownloadCounter(pCVar15,0);
  Curl_pgrsSetUploadSize(pCVar15,-1);
  Curl_pgrsSetDownloadSize(pCVar15,-1);
  pCVar15 = pcVar17->data;
  puVar2 = (undefined4 *)(pCVar15->req).protop;
  if ((pCVar15->set).opt_no_body == true) {
    *puVar2 = 1;
  }
  *local_38 = false;
  pcVar13 = *(char **)(puVar2 + 2);
  if (pcVar13 == (char *)0x0) {
    if ((pCVar15->set).upload == true) {
      pcVar13 = "Cannot APPEND without a mailbox.";
      goto LAB_00131255;
    }
    goto LAB_0013110f;
  }
  pcVar18 = (pcVar17->proto).imapc.mailbox;
  if (((pcVar18 == (char *)0x0) || (iVar9 = strcmp(pcVar13,pcVar18), iVar9 != 0)) ||
     ((*(char **)(puVar2 + 4) != (char *)0x0 &&
      ((pcVar12 = (local_50->proto).imapc.mailbox_uidvalidity, pcVar12 != (char *)0x0 &&
       (iVar9 = strcmp(*(char **)(puVar2 + 4),pcVar12), iVar9 != 0)))))) {
    bVar3 = false;
  }
  else {
    bVar3 = true;
  }
  pcVar17 = local_50;
  if ((pCVar15->set).upload != false) {
    if ((pCVar15->state).infilesize < 0) {
      Curl_failf(pCVar15,"Cannot APPEND with unknown input file size\n");
      return CURLE_UPLOAD_FAILED;
    }
    pcVar13 = imap_atom(pcVar13,false);
    pcVar17 = local_50;
    if (pcVar13 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    CVar8 = imap_sendf(local_50,"APPEND %s (\\Seen) {%lld}",pcVar13,
                       (local_50->data->state).infilesize);
    (*Curl_cfree)(pcVar13);
    if (CVar8 != CURLE_OK) {
      return CVar8;
    }
    iVar4 = IMAP_APPEND;
LAB_00131213:
    (pcVar17->proto).imapc.state = iVar4;
    goto LAB_0013121b;
  }
  if (*(long *)(puVar2 + 0xe) == 0) {
    if (!bVar3) {
      if ((*(long *)(puVar2 + 6) != 0) || (*(long *)(puVar2 + 0xc) != 0)) goto LAB_001311a1;
      goto LAB_0013110f;
    }
    if (*(long *)(puVar2 + 6) == 0) {
      if (*(long *)(puVar2 + 0xc) == 0) goto LAB_0013110f;
      CVar8 = imap_perform_search(local_50);
    }
    else {
      CVar8 = imap_perform_fetch(local_50);
    }
  }
  else {
    if (!bVar3) {
LAB_001311a1:
      (*Curl_cfree)(pcVar18);
      pcVar17 = local_50;
      (local_50->proto).imapc.mailbox = (char *)0x0;
      (*Curl_cfree)((local_50->proto).imapc.mailbox_uidvalidity);
      (pcVar17->proto).imapc.mailbox_uidvalidity = (char *)0x0;
      if (*(char **)(puVar2 + 2) == (char *)0x0) {
        pCVar15 = pcVar17->data;
        pcVar13 = "Cannot SELECT without a mailbox.";
LAB_00131255:
        Curl_failf(pCVar15,pcVar13);
        return CURLE_URL_MALFORMAT;
      }
      pcVar13 = imap_atom(*(char **)(puVar2 + 2),false);
      if (pcVar13 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      CVar8 = imap_sendf(pcVar17,"SELECT %s",pcVar13);
      (*Curl_cfree)(pcVar13);
      if (CVar8 != CURLE_OK) {
        return CVar8;
      }
      iVar4 = IMAP_SELECT;
      goto LAB_00131213;
    }
LAB_0013110f:
    pcVar17 = local_50;
    CVar8 = imap_perform_list(local_50);
  }
  if (CVar8 != CURLE_OK) {
    return CVar8;
  }
LAB_0013121b:
  p_Var5 = local_38;
  p_Var14 = local_38;
  CVar8 = imap_multi_statemach(pcVar17,local_38);
  if (CVar8 != CURLE_OK) {
    return CVar8;
  }
  if (*p_Var5 == true) {
    imap_dophase_done(pcVar17,SUB81(p_Var14,0));
    return CURLE_OK;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode imap_do(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;

  *done = FALSE; /* default to false */

  /* Parse the URL path */
  result = imap_parse_url_path(conn);
  if(result)
    return result;

  /* Parse the custom request */
  result = imap_parse_custom_request(conn);
  if(result)
    return result;

  result = imap_regular_transfer(conn, done);

  return result;
}